

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O1

SpatialAcc * __thiscall
iDynTree::Axis::getRotationSpatialAcc(SpatialAcc *__return_storage_ptr__,Axis *this,double d2theta)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  SpatialAcc *ret;
  
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] = 0.0;
  dVar1 = (this->direction).super_Vector3.m_data[0];
  dVar2 = (this->origin).super_Vector3.m_data[0];
  dVar4 = (this->origin).super_Vector3.m_data[1];
  dVar5 = (this->origin).super_Vector3.m_data[2];
  dVar6 = (this->direction).super_Vector3.m_data[1];
  dVar7 = (this->direction).super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (dVar7 * dVar4 - dVar5 * dVar6) * d2theta;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       (dVar1 * dVar5 - dVar2 * dVar7) * d2theta;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       (dVar2 * dVar6 - dVar1 * dVar4) * d2theta;
  dVar1 = (this->direction).super_Vector3.m_data[1] * d2theta;
  auVar3._8_4_ = SUB84(dVar1,0);
  auVar3._0_8_ = (this->direction).super_Vector3.m_data[0] * d2theta;
  auVar3._12_4_ = (int)((ulong)dVar1 >> 0x20);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_SpatialMotionVector).
   super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data = auVar3;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
       dVar7 * d2theta;
  return __return_storage_ptr__;
}

Assistant:

SpatialAcc Axis::getRotationSpatialAcc(const double d2theta) const
    {
        SpatialAcc ret;

        Eigen::Map<Eigen::Vector3d> lin(ret.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> ang(ret.getAngularVec3().data());

        Eigen::Map<const Eigen::Vector3d> dir(direction.data());
        Eigen::Map<const Eigen::Vector3d> orig(origin.data());

        lin = d2theta*(orig.cross(dir));
        ang = dir*d2theta;

        return ret;
    }